

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void google::protobuf::internal::TcParser::VerifyHasBitConsistency
               (MessageLite *msg,TcParseTableBase *table)

{
  uint uVar1;
  uint *puVar2;
  void **ppvVar3;
  Nullable<const_char_*> pcVar4;
  ArenaStringPtr *pAVar5;
  MessageLite **ppMVar6;
  unsigned_long *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  Cord *v1_00;
  Cord *v2_00;
  ushort uVar8;
  MessageLite *x;
  FieldEntry *pFVar9;
  MessageLite *x_00;
  long lVar10;
  uint uVar11;
  LogMessage local_90;
  string local_80;
  TcParseTableBase *table_local;
  MessageLite *msg_local;
  anon_class_24_3_63b2e8fc print_error;
  
  if (table->has_bits_offset != 0) {
    lVar10 = (ulong)table->num_field_entries * 0xc;
    table_local = table;
    msg_local = msg;
    for (pFVar9 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)table->field_entries_offset)
        ; (print_error.table = &table_local, lVar10 != 0 &&
          (print_error.msg = &msg_local, (pFVar9->type_card & 0x30) == 0x10)); pFVar9 = pFVar9 + 1)
    {
      uVar11 = pFVar9->has_idx;
      print_error.entry = pFVar9;
      puVar2 = RefAt<unsigned_int_const>(msg_local,(ulong)(uVar11 >> 3 & 0xfffffffc));
      uVar11 = 1 << ((byte)uVar11 & 0x1f) & *puVar2;
      x = table_local->class_data->prototype;
      uVar8 = pFVar9->type_card;
      x_00 = msg_local;
      if ((uVar8 & 8) != 0) {
        uVar1 = *(uint *)(&table_local->fast_idx_mask + table_local->aux_offset);
        ppvVar3 = RefAt<void_const*>(msg_local,(ulong)uVar1);
        x_00 = (MessageLite *)*ppvVar3;
        ppvVar3 = RefAt<void_const*>(x,(ulong)uVar1);
        x = (MessageLite *)*ppvVar3;
        uVar8 = pFVar9->type_card;
      }
      switch(uVar8 & 7) {
      case 1:
      case 3:
        if (uVar11 != 0) {
          return;
        }
        if ((uVar8 & 0x1c0) == 0xc0) {
          puVar7 = RefAt<unsigned_long>(x_00,(ulong)pFVar9->offset);
          local_80._M_dataplus._M_p = (pointer)*puVar7;
          puVar7 = RefAt<unsigned_long>(x,(ulong)pFVar9->offset);
          local_90._0_8_ = *puVar7;
          pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                             ((unsigned_long *)&local_80,(unsigned_long *)&local_90,
                              "RefAt<uint64_t>(base, entry.offset) == RefAt<uint64_t>(default_base, entry.offset)"
                             );
          if (pcVar4 != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_90,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x7d,pcVar4);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
            goto LAB_001db65f;
          }
        }
        else if ((uVar8 & 0x1c0) == 0x80) {
          puVar2 = RefAt<unsigned_int>(x_00,(ulong)pFVar9->offset);
          local_80._M_dataplus._M_p._0_4_ = *puVar2;
          puVar2 = RefAt<unsigned_int>(x,(ulong)pFVar9->offset);
          local_90.errno_saver_.saved_errno_ = *puVar2;
          pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                             ((uint *)&local_80,(uint *)&local_90,
                              "RefAt<uint32_t>(base, entry.offset) == RefAt<uint32_t>(default_base, entry.offset)"
                             );
          if (pcVar4 != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_90,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x78,pcVar4);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
            goto LAB_001db65f;
          }
        }
        else if (((uVar8 & 0x1c0) == 0) &&
                (pcVar4 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                                    ((bool *)((long)&x_00->_vptr_MessageLite + (ulong)pFVar9->offset
                                             ),
                                     (bool *)((long)&x->_vptr_MessageLite + (ulong)pFVar9->offset),
                                     "RefAt<bool>(base, entry.offset) == RefAt<bool>(default_base, entry.offset)"
                                    ), pcVar4 != (Nullable<const_char_*>)0x0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x73,pcVar4);
          VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
          ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
          absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
LAB_001db65f:
          std::__cxx11::string::~string((string *)&local_80);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_90);
        }
        break;
      default:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb9);
      case 5:
        switch(uVar8 >> 6 & 7) {
        case 0:
          if ((uVar11 != 0) &&
             (pAVar5 = RefAt<google::protobuf::internal::ArenaStringPtr>(x_00,(ulong)pFVar9->offset)
             , ((ulong)(pAVar5->tagged_ptr_).ptr_ & 3) == 0)) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_90,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x88,"!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault()");
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
            goto LAB_001db65f;
          }
          break;
        case 1:
          if (uVar11 == 0) {
            v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 RefAt<google::protobuf::internal::InlinedStringField>(x_00,(ulong)pFVar9->offset);
            v2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 RefAt<google::protobuf::internal::InlinedStringField>(x,(ulong)pFVar9->offset);
            pcVar4 = absl::lts_20250127::log_internal::
                     Check_EQImpl<std::__cxx11::string,std::__cxx11::string>
                               (v1,v2,
                                "RefAt<InlinedStringField>(base, entry.offset).Get() == RefAt<InlinedStringField>(default_base, entry.offset).Get()"
                               );
            if (pcVar4 != (Nullable<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_90,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x9d,pcVar4);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
              absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
              goto LAB_001db65f;
            }
          }
          break;
        case 2:
          if (uVar11 == 0) {
            v1_00 = RefAt<absl::lts_20250127::Cord>(x_00,(ulong)pFVar9->offset);
            v2_00 = RefAt<absl::lts_20250127::Cord>(x,(ulong)pFVar9->offset);
            pcVar4 = absl::lts_20250127::log_internal::
                     Check_EQImpl<absl::lts_20250127::Cord,absl::lts_20250127::Cord>
                               (v1_00,v2_00,
                                "RefAt<absl::Cord>(base, entry.offset) == RefAt<absl::Cord>(default_base, entry.offset)"
                               );
            if (pcVar4 != (Nullable<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_90,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x94,pcVar4);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
              absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
              goto LAB_001db65f;
            }
          }
          break;
        case 4:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xa2);
        }
        break;
      case 6:
        if ((uVar8 & 0x180) != 0) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb3);
        }
        if ((uVar11 != 0) &&
           (ppMVar6 = RefAt<google::protobuf::MessageLite_const*>(x_00,(ulong)pFVar9->offset),
           *ppMVar6 == (MessageLite *)0x0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0xab,"RefAt<const MessageLite*>(base, entry.offset) != nullptr");
          VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
          ::$_0::operator()[abi_cxx11_(&local_80,&print_error);
          absl::lts_20250127::log_internal::LogMessage::operator<<(&local_90,&local_80);
          goto LAB_001db65f;
        }
      }
      lVar10 = lVar10 + -0xc;
    }
  }
  return;
}

Assistant:

void TcParser::VerifyHasBitConsistency(const MessageLite* msg,
                                       const TcParseTableBase* table) {
  namespace fl = internal::field_layout;
  if (table->has_bits_offset == 0) {
    // Nothing to check
    return;
  }

  for (const auto& entry : table->field_entries()) {
    const auto print_error = [&] {
      return absl::StrFormat("Type=%s Field=%d\n", msg->GetTypeName(),
                             FieldNumber(table, &entry));
    };
    if ((entry.type_card & fl::kFcMask) != fl::kFcOptional) return;
    const bool has_bit = ReadHas(entry, msg);
    const void* base = msg;
    const void* default_base = table->default_instance();
    if ((entry.type_card & field_layout::kSplitMask) ==
        field_layout::kSplitTrue) {
      const size_t offset = table->field_aux(kSplitOffsetAuxIdx)->offset;
      base = TcParser::RefAt<const void*>(base, offset);
      default_base = TcParser::RefAt<const void*>(default_base, offset);
    }
    switch (entry.type_card & fl::kFkMask) {
      case fl::kFkVarint:
      case fl::kFkFixed:
        // Numerics can have any value when the has bit is on.
        if (has_bit) return;
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRep8Bits:
            ABSL_CHECK_EQ(RefAt<bool>(base, entry.offset),
                          RefAt<bool>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep32Bits:
            ABSL_CHECK_EQ(RefAt<uint32_t>(base, entry.offset),
                          RefAt<uint32_t>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep64Bits:
            ABSL_CHECK_EQ(RefAt<uint64_t>(base, entry.offset),
                          RefAt<uint64_t>(default_base, entry.offset))
                << print_error();
            break;
        }
        break;

      case fl::kFkString:
        switch (entry.type_card & fl::kRepMask) {
          case field_layout::kRepAString:
            if (has_bit) {
              // Must not point to the default.
              ABSL_CHECK(!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault())
                  << print_error();
            } else {
              // We should technically check that the value matches the default
              // value of the field, but the prototype does not actually contain
              // this value. Non-empty defaults are loaded on access.
            }
            break;
          case field_layout::kRepCord:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(RefAt<absl::Cord>(base, entry.offset),
                            RefAt<absl::Cord>(default_base, entry.offset))
                  << print_error();
            }
            break;
          case field_layout::kRepIString:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(
                  RefAt<InlinedStringField>(base, entry.offset).Get(),
                  RefAt<InlinedStringField>(default_base, entry.offset).Get())
                  << print_error();
            }
            break;
          case field_layout::kRepSString:
            Unreachable();
        }
        break;
      case fl::kFkMessage:
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRepMessage:
          case fl::kRepGroup:
            if (has_bit) {
              ABSL_CHECK(RefAt<const MessageLite*>(base, entry.offset) !=
                         nullptr)
                  << print_error();
            } else {
              // An off has_bit does not imply a null pointer.
              // We might have a previous instance that we cached.
            }
            break;
          default:
            Unreachable();
        }
        break;

      default:
        // All other types are not `optional`.
        Unreachable();
    }
  }
}